

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_decompose.hpp
# Opt level: O0

lest * __thiscall lest::to_string_abi_cxx11_(lest *this,char **txt)

{
  char *pcVar1;
  allocator local_79;
  string local_78 [32];
  string local_58 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  char **local_18;
  char **txt_local;
  
  pcVar1 = *txt;
  local_18 = txt;
  txt_local = (char **)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_78,pcVar1,&local_79);
  std::operator+((char *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x15d3f7);
  std::operator+(local_38,(char *)local_58);
  std::__cxx11::string::string((string *)this,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::__cxx11::string::~string(local_78);
  std::allocator<char>::~allocator((allocator<char> *)&local_79);
  return this;
}

Assistant:

inline std::string to_string( char const *   const & txt ) { return "\"" + std::string( txt ) + "\"" ; }